

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O0

void __thiscall
gl3cts::ClipDistance::Utility::Program::Program
          (Program *this,Functions *gl,string *vertex_shader_code,string *fragment_shader_code,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *transform_feedback_varyings)

{
  LinkageStatus local_c8;
  CompilationStatus local_a0;
  CompilationStatus local_68;
  GLchar *local_40;
  GLchar *fragment_shader_code_c;
  GLchar *vertex_shader_code_c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *transform_feedback_varyings_local;
  string *fragment_shader_code_local;
  string *vertex_shader_code_local;
  Functions *gl_local;
  Program *this_local;
  
  vertex_shader_code_c = (GLchar *)transform_feedback_varyings;
  transform_feedback_varyings_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)fragment_shader_code;
  fragment_shader_code_local = vertex_shader_code;
  vertex_shader_code_local = (string *)gl;
  gl_local = (Functions *)this;
  CompilationStatus::CompilationStatus(&this->m_vertex_shader_status);
  CompilationStatus::CompilationStatus(&this->m_fragment_shader_status);
  LinkageStatus::LinkageStatus(&this->m_program_status);
  this->m_gl = (Functions *)vertex_shader_code_local;
  fragment_shader_code_c = (GLchar *)std::__cxx11::string::c_str();
  local_40 = (GLchar *)std::__cxx11::string::c_str();
  compileShader(&local_68,this,0x8b31,&fragment_shader_code_c);
  CompilationStatus::operator=(&this->m_vertex_shader_status,&local_68);
  CompilationStatus::~CompilationStatus(&local_68);
  compileShader(&local_a0,this,0x8b30,&local_40);
  CompilationStatus::operator=(&this->m_fragment_shader_status,&local_a0);
  CompilationStatus::~CompilationStatus(&local_a0);
  (this->m_program_status).program_id = 0;
  if (((this->m_vertex_shader_status).shader_compilation_status != 0) &&
     ((this->m_fragment_shader_status).shader_compilation_status != 0)) {
    linkShaders(&local_c8,this,&this->m_vertex_shader_status,&this->m_fragment_shader_status,
                transform_feedback_varyings);
    LinkageStatus::operator=(&this->m_program_status,&local_c8);
    LinkageStatus::~LinkageStatus(&local_c8);
  }
  if ((this->m_vertex_shader_status).shader_id != 0) {
    (*this->m_gl->deleteShader)((this->m_vertex_shader_status).shader_id);
    (this->m_vertex_shader_status).shader_id = 0;
  }
  if ((this->m_fragment_shader_status).shader_id != 0) {
    (*this->m_gl->deleteShader)((this->m_fragment_shader_status).shader_id);
    (this->m_fragment_shader_status).shader_id = 0;
  }
  return;
}

Assistant:

gl3cts::ClipDistance::Utility::Program::Program(const glw::Functions& gl, const std::string& vertex_shader_code,
												const std::string&		 fragment_shader_code,
												std::vector<std::string> transform_feedback_varyings)
	: m_gl(gl)
{
	/* Compilation */
	const glw::GLchar* vertex_shader_code_c   = (const glw::GLchar*)vertex_shader_code.c_str();
	const glw::GLchar* fragment_shader_code_c = (const glw::GLchar*)fragment_shader_code.c_str();

	m_vertex_shader_status   = compileShader(GL_VERTEX_SHADER, &vertex_shader_code_c);
	m_fragment_shader_status = compileShader(GL_FRAGMENT_SHADER, &fragment_shader_code_c);

	/* Linking */
	m_program_status.program_id = 0;
	if (m_vertex_shader_status.shader_compilation_status && m_fragment_shader_status.shader_compilation_status)
	{
		m_program_status = linkShaders(m_vertex_shader_status, m_fragment_shader_status, transform_feedback_varyings);
	}

	/* Cleaning */
	if (m_vertex_shader_status.shader_id)
	{
		m_gl.deleteShader(m_vertex_shader_status.shader_id);

		m_vertex_shader_status.shader_id = 0;
	}

	if (m_fragment_shader_status.shader_id)
	{
		m_gl.deleteShader(m_fragment_shader_status.shader_id);

		m_fragment_shader_status.shader_id = 0;
	}
}